

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIComboBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIComboBox::draw(CGUIComboBox *this)

{
  vector2d<int> vVar1;
  long *plVar2;
  IGUIElement *pIVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  vector2d<int> vVar6;
  undefined4 extraout_var_01;
  undefined8 uVar7;
  IGUIElement *in_RDI;
  CGUIComboBox *in_stack_00000040;
  rect<int> frameRect;
  IGUIElement *currentFocus;
  IGUISkin *skin;
  s32 in_stack_ffffffffffffff6c;
  CGUIComboBox *in_stack_ffffffffffffff70;
  IGUIElement *pIVar8;
  bool local_51;
  vector2d<int> local_3c;
  vector2d<int> local_34;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  IGUIElement *local_18;
  IGUIElement *local_10;
  int extraout_var_00;
  
  if ((in_RDI->IsVisible & 1U) != 0) {
    iVar4 = (*in_RDI->Environment->_vptr_IGUIEnvironment[0xc])();
    local_10 = (IGUIElement *)CONCAT44(extraout_var,iVar4);
    (*(local_10->super_IEventReceiver)._vptr_IEventReceiver[2])(local_10,0);
    updateListButtonWidth(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    vVar1 = in_RDI[1].AbsoluteRect.UpperLeftCorner;
    vVar6.X = (*(local_10->super_IEventReceiver)._vptr_IEventReceiver[6])(local_10,0);
    vVar6.Y = extraout_var_00;
    if ((vVar1 != vVar6) && (*(long *)&in_RDI->field_0x148 != 0)) {
      openCloseMenu(in_stack_00000040);
      openCloseMenu(in_stack_00000040);
    }
    iVar4 = (*in_RDI->Environment->_vptr_IGUIEnvironment[2])();
    local_18 = (IGUIElement *)CONCAT44(extraout_var_01,iVar4);
    if (local_18 != (IGUIElement *)in_RDI[1].super_IEventReceiver._vptr_IEventReceiver) {
      local_51 = true;
      if (local_18 != in_RDI) {
        local_51 = IGUIElement::isMyChild(in_RDI,local_18);
      }
      *(bool *)&in_RDI[1].RelativeRect.LowerRightCorner.X = local_51;
      in_RDI[1].super_IEventReceiver._vptr_IEventReceiver = (_func_int **)local_18;
    }
    plVar2 = *(long **)&in_RDI->field_0x140;
    local_1c = (**(local_10->super_IEventReceiver)._vptr_IEventReceiver)(local_10,10);
    (**(code **)(*plVar2 + 0x160))(plVar2,local_1c);
    uVar5 = (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x12])();
    if ((uVar5 & 1) == 0) {
      (**(code **)(**(long **)&in_RDI->field_0x140 + 0x168))(*(long **)&in_RDI->field_0x140,0);
      plVar2 = *(long **)&in_RDI->field_0x140;
      local_24 = (**(local_10->super_IEventReceiver)._vptr_IEventReceiver)(local_10,9);
      (**(code **)(*plVar2 + 0x138))(plVar2,local_24);
    }
    else {
      (**(code **)(**(long **)&in_RDI->field_0x140 + 0x168))
                (*(long **)&in_RDI->field_0x140,(byte)in_RDI[1].RelativeRect.LowerRightCorner.X & 1)
      ;
      plVar2 = *(long **)&in_RDI->field_0x140;
      uVar7 = 8;
      if ((in_RDI[1].RelativeRect.LowerRightCorner.X & 1) != 0) {
        uVar7 = 0xb;
      }
      local_20 = (**(local_10->super_IEventReceiver)._vptr_IEventReceiver)(local_10,uVar7);
      (**(code **)(*plVar2 + 0x138))(plVar2,local_20);
    }
    plVar2 = *(long **)&in_RDI->field_0x138;
    iVar4 = (*(local_10->super_IEventReceiver)._vptr_IEventReceiver[10])(local_10,6);
    pIVar8 = local_10;
    uVar5 = (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x12])();
    uVar7 = 0x15;
    if ((uVar5 & 1) != 0) {
      uVar7 = 0x12;
    }
    local_28 = (**(pIVar8->super_IEventReceiver)._vptr_IEventReceiver)(pIVar8,uVar7);
    (**(code **)(*plVar2 + 400))(plVar2,0,iVar4,local_28,0);
    plVar2 = *(long **)&in_RDI->field_0x138;
    iVar4 = (*(local_10->super_IEventReceiver)._vptr_IEventReceiver[10])(local_10,6);
    pIVar8 = local_10;
    uVar5 = (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x12])();
    uVar7 = 0x15;
    if ((uVar5 & 1) != 0) {
      uVar7 = 0x12;
    }
    local_2c = (**(pIVar8->super_IEventReceiver)._vptr_IEventReceiver)(pIVar8,uVar7);
    (**(code **)(*plVar2 + 400))(plVar2,1,iVar4,local_2c,0);
    pIVar3 = local_10;
    local_3c = (in_RDI->AbsoluteRect).UpperLeftCorner;
    local_34 = (in_RDI->AbsoluteRect).LowerRightCorner;
    uVar5 = (**(local_10->super_IEventReceiver)._vptr_IEventReceiver)(local_10,3);
    (*(pIVar3->super_IEventReceiver)._vptr_IEventReceiver[0xe])
              (pIVar3,in_RDI,(ulong)uVar5,1,1,&local_3c,&in_RDI->AbsoluteClippingRect);
    IGUIElement::draw(pIVar8);
  }
  return;
}

Assistant:

void CGUIComboBox::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();

	updateListButtonWidth(skin->getSize(EGDS_SCROLLBAR_SIZE));

	// font changed while the listbox is open?
	if (ActiveFont != skin->getFont() && ListBox) {
		// close and re-open to use new font-size
		openCloseMenu();
		openCloseMenu();
	}

	IGUIElement *currentFocus = Environment->getFocus();
	if (currentFocus != LastFocus) {
		HasFocus = currentFocus == this || isMyChild(currentFocus);
		LastFocus = currentFocus;
	}

	// set colors each time as skin-colors can be changed
	SelectedText->setBackgroundColor(skin->getColor(EGDC_HIGH_LIGHT));
	if (isEnabled()) {
		SelectedText->setDrawBackground(HasFocus);
		SelectedText->setOverrideColor(skin->getColor(HasFocus ? EGDC_HIGH_LIGHT_TEXT : EGDC_BUTTON_TEXT));
	} else {
		SelectedText->setDrawBackground(false);
		SelectedText->setOverrideColor(skin->getColor(EGDC_GRAY_TEXT));
	}
	ListButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_DOWN), skin->getColor(isEnabled() ? EGDC_WINDOW_SYMBOL : EGDC_GRAY_WINDOW_SYMBOL));
	ListButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_DOWN), skin->getColor(isEnabled() ? EGDC_WINDOW_SYMBOL : EGDC_GRAY_WINDOW_SYMBOL));

	core::rect<s32> frameRect(AbsoluteRect);

	// draw the border

	skin->draw3DSunkenPane(this, skin->getColor(EGDC_3D_HIGH_LIGHT),
			true, true, frameRect, &AbsoluteClippingRect);

	// draw children
	IGUIElement::draw();
}